

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

int jas_stream_pad(jas_stream_t *stream,int n,int c)

{
  uchar *puVar1;
  int iVar2;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  int m;
  int c_local;
  int n_local;
  jas_stream_t *stream_local;
  
  iVar2 = jas_getdbglevel();
  if (99 < iVar2) {
    jas_eprintf("jas_stream_pad(%p, %d, %d)\n",stream,(ulong)(uint)n,(ulong)(uint)c);
  }
  local_24 = n;
  if (n < 0) {
    jas_deprecated("negative count for jas_stream_pad");
  }
  while( true ) {
    if (local_24 < 1) {
      return n;
    }
    if ((stream->flags_ & 7U) == 0) {
      if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
        stream->bufmode_ = stream->bufmode_ | 0x20;
        iVar2 = stream->cnt_ + -1;
        stream->cnt_ = iVar2;
        if (iVar2 < 0) {
          local_2c = jas_stream_flushbuf(stream,c & 0xff);
        }
        else {
          stream->rwcnt_ = stream->rwcnt_ + 1;
          puVar1 = stream->ptr_;
          stream->ptr_ = puVar1 + 1;
          *puVar1 = (uchar)c;
          local_2c = c & 0xff;
        }
        local_28 = local_2c;
      }
      else {
        stream->flags_ = stream->flags_ | 4;
        local_28 = 0xffffffff;
      }
      local_30 = local_28;
    }
    else {
      local_30 = 0xffffffff;
    }
    if (local_30 == 0xffffffff) break;
    local_24 = local_24 + -1;
  }
  return n - local_24;
}

Assistant:

int jas_stream_pad(jas_stream_t *stream, int n, int c)
{
	int m;

	JAS_DBGLOG(100, ("jas_stream_pad(%p, %d, %d)\n", stream, n, c));

	if (n < 0) {
		jas_deprecated("negative count for jas_stream_pad");
	}
	m = n;
	for (m = n; m > 0; --m) {
		if (jas_stream_putc(stream, c) == EOF)
			return n - m;
	}
	return n;
}